

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  long lVar2;
  
  this->_VtxCurrentIdx = 0;
  pIVar1 = (this->CmdBuffer).Data;
  lVar2 = (long)(this->CmdBuffer).Size;
  if (pIVar1[lVar2 + -1].ElemCount != 0) {
    AddDrawCmd(this);
    return;
  }
  if (pIVar1[lVar2 + -1].UserCallback != (ImDrawCallback)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x21d,"_OnChangedVtxOffset","ImGui ASSERT FAILED: %s",
                "curr_cmd->UserCallback == NULL");
  }
  pIVar1[lVar2 + -1].VtxOffset = (this->_CmdHeader).VtxOffset;
  return;
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}